

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dynamic_groups.c
# Opt level: O3

int main(void)

{
  tommy_list ptVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  rtr_mgr_group group5;
  rtr_socket rtr_tcp5;
  tr_socket tr_tcp5;
  rtr_mgr_group group4;
  rtr_socket rtr_tcp4;
  tr_socket tr_tcp4;
  rtr_mgr_group group3;
  rtr_socket rtr_tcp3;
  tr_socket tr_tcp3;
  rtr_mgr_config *conf;
  rtr_mgr_group group2;
  rtr_socket rtr_tcp2;
  tr_socket tr_tcp2;
  rtr_socket rtr_tcp;
  tr_socket tr_tcp;
  char tcp_port [5];
  rtr_mgr_group groups [1];
  char tcp_host [33];
  rtr_mgr_group local_4b0;
  rtr_socket local_498;
  tr_socket local_418;
  rtr_mgr_group local_3e0;
  rtr_socket local_3c8;
  tr_socket local_348;
  rtr_mgr_group local_310;
  rtr_socket local_2f8;
  tr_socket local_278;
  rtr_mgr_config *local_240;
  rtr_mgr_group local_238;
  rtr_socket local_220;
  tr_socket local_1a0;
  rtr_socket local_168;
  tr_tcp_config local_e8;
  tr_socket local_b8;
  char local_80 [8];
  rtr_mgr_group local_78;
  char local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8.host = local_58;
  builtin_strncpy(local_58 + 0x10,"cs.tu-dresden.de",0x11);
  builtin_strncpy(local_58,"rpki-cache.netd.",0x10);
  uVar5 = 0;
  local_e8.port = local_80;
  builtin_strncpy(local_80,"3323",5);
  local_e8.bindaddr = (char *)0x0;
  local_e8.data._0_4_ = 0;
  local_e8.data._4_4_ = 0;
  local_e8.new_socket._0_4_ = 0;
  local_e8._36_8_ = 0;
  tr_tcp_init(&local_e8,&local_b8);
  local_168.tr_socket = &local_b8;
  local_78.sockets = (rtr_socket **)malloc(8);
  local_78.sockets_len = 1;
  *local_78.sockets = &local_168;
  local_78.preference = '\x01';
  tr_tcp_init(&local_e8,&local_1a0);
  local_220.tr_socket = &local_1a0;
  local_238.sockets = (rtr_socket **)malloc(8);
  local_238.sockets_len = 1;
  *local_238.sockets = &local_220;
  local_238.preference = '\x02';
  rtr_mgr_init(&local_240,&local_78,1,connection_status_callback,(void *)0x0);
  rtr_mgr_add_roa_support(local_240,(pfx_update_fp)0x0);
  rtr_mgr_add_aspa_support(local_240,(aspa_update_fp)0x0);
  rtr_mgr_add_spki_support(local_240,(spki_update_fp)0x0);
  rtr_mgr_setup_sockets(local_240,&local_78,1,0x32,600,600);
  rtr_mgr_start(local_240);
  _Var2 = rtr_mgr_conf_in_sync(local_240);
  if (!_Var2) {
    iVar3 = 1;
    do {
      if ((connection_status == RTR_MGR_ERROR) || (0x4f < uVar5)) goto LAB_00105b11;
      uVar5 = uVar5 + 1;
      sleep(1);
      _Var2 = rtr_mgr_conf_in_sync(local_240);
    } while (!_Var2);
  }
  if (local_240->len != 1) {
    __assert_fail("conf->len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0x54,"int main(void)");
  }
  iVar3 = rtr_mgr_add_group(local_240,&local_238);
  if (iVar3 != 0) {
    __assert_fail("retval == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0x57,"int main(void)");
  }
  iVar3 = rtr_mgr_add_group(local_240,&local_238);
  if (iVar3 != -2) {
    __assert_fail("retval == RTR_INVALID_PARAM",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0x5c,"int main(void)");
  }
  ptVar1 = local_240->groups->list;
  if (*(char *)(*(long *)((long)ptVar1->data + 0x20) + 0xc) != '\x01') {
    __assert_fail("group_node->group->preference == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0x62,"int main(void)");
  }
  if (*(char *)(*(long *)((long)ptVar1->next->data + 0x20) + 0xc) != '\x02') {
    __assert_fail("group_node2->group->preference == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,99,"int main(void)");
  }
  if (local_240->len != 2) {
    __assert_fail("conf->len == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,100,"int main(void)");
  }
  rtr_mgr_remove_group(local_240,1);
  if (*(char *)(*(long *)((long)local_240->groups->list->data + 0x20) + 0xc) != '\x02') {
    __assert_fail("group_node->group->preference == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0x6a,"int main(void)");
  }
  if (local_240->len != 1) {
    __assert_fail("conf->len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0x6b,"int main(void)");
  }
  tr_tcp_init(&local_e8,&local_278);
  local_2f8.tr_socket = &local_278;
  local_310.sockets = (rtr_socket **)malloc(8);
  local_310.sockets_len = 1;
  *local_310.sockets = &local_2f8;
  local_310.preference = '\x03';
  tr_tcp_init(&local_e8,&local_348);
  local_3c8.tr_socket = &local_348;
  local_3e0.sockets = (rtr_socket **)malloc(8);
  local_3e0.sockets_len = 1;
  *local_3e0.sockets = &local_3c8;
  local_3e0.preference = '\x04';
  rtr_mgr_add_group(local_240,&local_3e0);
  rtr_mgr_remove_group(local_240,2);
  rtr_mgr_add_group(local_240,&local_310);
  if (*(char *)(*(long *)((long)local_240->groups->list->data + 0x20) + 0xc) != '\x03') {
    __assert_fail("group_node->group->preference == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0x8e,"int main(void)");
  }
  iVar3 = rtr_mgr_remove_group(local_240,10);
  if (iVar3 != -1) {
    __assert_fail("retval == RTR_ERROR",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0x92,"int main(void)");
  }
  tr_tcp_init(&local_e8,&local_418);
  local_498.tr_socket = &local_418;
  local_4b0.sockets = (rtr_socket **)malloc(8);
  local_4b0.sockets_len = 1;
  *local_4b0.sockets = &local_498;
  local_4b0.preference = '\x05';
  iVar3 = 100;
  do {
    iVar4 = rtr_mgr_add_group(local_240,&local_4b0);
    local_4b0.preference = local_4b0.preference + '\x01';
    if (iVar4 != 0) {
      __assert_fail("retval == RTR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                    ,0xa3,"int main(void)");
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  uVar5 = 0x69;
  do {
    uVar5 = uVar5 - 1;
    iVar3 = rtr_mgr_remove_group(local_240,uVar5);
    if (iVar3 != 0) {
      __assert_fail("retval == RTR_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                    ,0xa9,"int main(void)");
    }
  } while (5 < uVar5);
  rtr_mgr_remove_group(local_240,4);
  iVar3 = rtr_mgr_remove_group(local_240,3);
  if (iVar3 != -1) {
    __assert_fail("retval == RTR_ERROR",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_dynamic_groups.c"
                  ,0xb0,"int main(void)");
  }
  rtr_mgr_stop(local_240);
  rtr_mgr_free(local_240);
  free(local_78.sockets);
  free(local_238.sockets);
  free(local_310.sockets);
  free(local_3e0.sockets);
  free(local_4b0.sockets);
  iVar3 = 0;
LAB_00105b11:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int main(void)
{
	int retval = 0;
	char tcp_host[] = "rpki-cache.netd.cs.tu-dresden.de";
	char tcp_port[] = "3323";

	/* create a TCP transport socket */
	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {
		tcp_host, //IP
		tcp_port, //Port
		NULL, //Source address
		NULL, //data
		NULL, //new_socket()
		0, // connect timeout
	};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mr_group array with 1 element */
	groups[0].sockets = malloc(sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	struct tr_socket tr_tcp2;
	struct rtr_socket rtr_tcp2;
	struct rtr_mgr_group group2;

	tr_tcp_init(&tcp_config, &tr_tcp2);
	rtr_tcp2.tr_socket = &tr_tcp2;
	group2.sockets = malloc(sizeof(struct rtr_socket *));
	group2.sockets_len = 1;
	group2.sockets[0] = &rtr_tcp2;
	group2.preference = 2;

	struct rtr_mgr_config *conf;

	rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL);
	rtr_mgr_add_roa_support(conf, NULL);
	rtr_mgr_add_aspa_support(conf, NULL);
	rtr_mgr_add_spki_support(conf, NULL);
	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);

	//start the connection manager
	rtr_mgr_start(conf);

	int sleep_counter = 0;
	// wait 20 sec till at least one group is fully synchronized with the server
	// otherwise EXIT_FAILURE.
	while (!rtr_mgr_conf_in_sync(conf)) {
		sleep_counter++;
		if (connection_status == RTR_MGR_ERROR || sleep_counter > connection_timeout)
			return EXIT_FAILURE;

		sleep(1);
	}

	assert(conf->len == 1);

	retval = rtr_mgr_add_group(conf, &group2);
	assert(retval == RTR_SUCCESS);

	//checking behavior in case the group preference already exists
	//by adding the same group twice.
	retval = rtr_mgr_add_group(conf, &group2);
	assert(retval == RTR_INVALID_PARAM);

	tommy_node *node = tommy_list_head(&conf->groups->list);
	struct rtr_mgr_group_node *group_node = node->data;
	struct rtr_mgr_group_node *group_node2 = node->next->data;

	assert(group_node->group->preference == 1);
	assert(group_node2->group->preference == 2);
	assert(conf->len == 2);

	rtr_mgr_remove_group(conf, 1);

	node = tommy_list_head(&conf->groups->list);
	group_node = node->data;
	assert(group_node->group->preference == 2);
	assert(conf->len == 1);

	struct tr_socket tr_tcp3;
	struct rtr_socket rtr_tcp3;
	struct rtr_mgr_group group3;

	tr_tcp_init(&tcp_config, &tr_tcp3);
	rtr_tcp3.tr_socket = &tr_tcp3;
	group3.sockets = malloc(sizeof(struct rtr_socket *));
	group3.sockets_len = 1;
	group3.sockets[0] = &rtr_tcp3;
	group3.preference = 3;

	struct tr_socket tr_tcp4;
	struct rtr_socket rtr_tcp4;
	struct rtr_mgr_group group4;

	tr_tcp_init(&tcp_config, &tr_tcp4);
	rtr_tcp4.tr_socket = &tr_tcp4;
	group4.sockets = malloc(sizeof(struct rtr_socket *));
	group4.sockets_len = 1;
	group4.sockets[0] = &rtr_tcp4;
	group4.preference = 4;

	rtr_mgr_add_group(conf, &group4);

	// remove group 2 so group 4 becomes the active group.
	rtr_mgr_remove_group(conf, 2);

	// add group 3 which has a higher preference than group 4
	// and check whether it will be set as the active group.
	rtr_mgr_add_group(conf, &group3);

	node = tommy_list_head(&conf->groups->list);
	group_node = node->data;
	assert(group_node->group->preference == 3);

	//try to remove non-existent group
	retval = rtr_mgr_remove_group(conf, 10);
	assert(retval == RTR_ERROR);

	struct tr_socket tr_tcp5;
	struct rtr_socket rtr_tcp5;
	struct rtr_mgr_group group5;

	tr_tcp_init(&tcp_config, &tr_tcp5);
	rtr_tcp5.tr_socket = &tr_tcp5;
	group5.sockets = malloc(sizeof(struct rtr_socket *));
	group5.sockets_len = 1;
	group5.sockets[0] = &rtr_tcp5;
	group5.preference = 5;

	//add 100 groups
	for (int i = 0; i < 100; i++) {
		retval = rtr_mgr_add_group(conf, &group5);
		group5.preference++;
		assert(retval == RTR_SUCCESS);
	}

	//remove 100 groups
	for (int i = 104; i >= 5; i--) {
		retval = rtr_mgr_remove_group(conf, i);
		assert(retval == RTR_SUCCESS);
	}

	rtr_mgr_remove_group(conf, 4);

	//try to remove last remainig group.
	retval = rtr_mgr_remove_group(conf, 3);
	assert(retval == RTR_ERROR);
	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);
	free(groups[0].sockets);
	free(group2.sockets);
	free(group3.sockets);
	free(group4.sockets);
	free(group5.sockets);
}